

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dbg.c
# Opt level: O3

void dbgpval(dbgcxdef *ctx,runsdef *val,_func_void_void_ptr_char_ptr_int *dispfn,void *dispctx,
            int showtype)

{
  bool bVar1;
  size_t sVar2;
  uint uVar3;
  size_t sVar4;
  char *__s;
  uint len;
  uchar *p;
  uchar buf [40];
  uint local_64;
  ushort *local_60;
  ushort local_58 [20];
  
  local_60 = local_58;
  switch(val->runstyp) {
  case '\x01':
    sprintf((char *)local_58,"%ld",(val->runsv).runsvnum);
    sVar4 = strlen((char *)local_58);
    local_64 = (uint)sVar4;
    __s = "number";
    break;
  case '\x02':
    local_64 = dbgnam(ctx,(char *)local_58,2,(uint)(val->runsv).runsvobj);
    sVar4 = (size_t)local_64;
    __s = "object";
    break;
  case '\x03':
    local_64 = *(ushort *)(val->runsv).runsvstr - 2;
    sVar4 = (size_t)local_64;
    local_60 = (ushort *)((long)(val->runsv).runsvstr + 2);
    __s = "string";
    break;
  default:
    local_60 = (ushort *)0x13a57f;
    local_64 = 0xe;
    sVar4 = 0xe;
    goto LAB_00121657;
  case '\x05':
    local_60 = (ushort *)0x139d4d;
    local_64 = 3;
    sVar4 = 3;
    goto LAB_00121657;
  case '\a':
    if (showtype != 0) {
      (*dispfn)(dispctx,"list: ",6);
    }
    (*dispfn)(dispctx,"[",1);
    local_60 = (ushort *)((long)(val->runsv).runsvstr + 2);
    local_64 = *(ushort *)(val->runsv).runsvstr - 2;
    if (local_64 != 0) {
      do {
        dbgpbval(ctx,(uint)(byte)*local_60,(byte *)((long)local_60 + 1),dispfn,dispctx);
        lstadv((uchar **)&local_60,&local_64);
        if (local_64 == 0) break;
        (*dispfn)(dispctx," ",1);
      } while (local_64 != 0);
    }
    (*dispfn)(dispctx,"]",1);
    local_64 = 0;
    sVar4 = 0;
    goto LAB_00121706;
  case '\b':
    local_60 = (ushort *)0x139d51;
    local_64 = 4;
    sVar4 = 4;
LAB_00121657:
    bVar1 = false;
    goto LAB_0012172e;
  case '\n':
    local_64 = dbgnam(ctx,(char *)local_58,1,(uint)(val->runsv).runsvobj);
    sVar4 = (size_t)local_64;
    __s = "function pointer";
    break;
  case '\r':
    local_64 = dbgnam(ctx,(char *)local_58,3,(uint)(val->runsv).runsvobj);
    sVar4 = (size_t)local_64;
    __s = "property pointer";
  }
  if (showtype == 0) {
LAB_00121706:
    if (val->runstyp == '\x03') {
      (*dispfn)(dispctx,"\'",1);
      bVar1 = false;
      sVar4 = (size_t)local_64;
    }
    else {
      bVar1 = false;
    }
  }
  else {
    sVar2 = strlen(__s);
    (*dispfn)(dispctx,__s,(int)sVar2);
    (*dispfn)(dispctx,": ",2);
    bVar1 = true;
  }
  uVar3 = (uint)sVar4;
  if (uVar3 < 0x28) {
LAB_0012172e:
    uVar3 = (uint)sVar4;
    *(undefined1 *)((long)local_58 + (sVar4 & 0xffffffff)) = 0;
  }
  if ((val->runstyp == '\r') || (val->runstyp == '\n')) {
    (*dispfn)(dispctx,"&",1);
    uVar3 = local_64;
  }
  if (uVar3 != 0) {
    (*dispfn)(dispctx,(char *)local_60,uVar3);
  }
  if (!bVar1 && val->runstyp == '\x03') {
    (*dispfn)(dispctx,"\'",1);
  }
  return;
}

Assistant:

void dbgpval(dbgcxdef *ctx, runsdef *val,
             void (*dispfn)(void *ctx, const char *str, int strl),
             void *dispctx,
             int showtype)
{
    uchar   buf[TOKNAMMAX + 1];
    uint    len;
    uchar  *p = buf;
    char   *typ = 0;
    
    switch(val->runstyp)
    {
    case DAT_NUMBER:
        sprintf((char *)buf, "%ld", val->runsv.runsvnum);
        len = strlen((char *)buf);
        typ = "number";
        break;
        
    case DAT_OBJECT:
        len = dbgnam(ctx, (char *)buf, TOKSTOBJ, val->runsv.runsvobj);
        typ = "object";
        break;
        
    case DAT_SSTRING:
        len = osrp2(val->runsv.runsvstr) - 2;
        p = val->runsv.runsvstr + 2;
        typ = "string";
        break;
        
    case DAT_NIL:
        p = (uchar *)"nil";
        len = 3;
        break;

    case DAT_LIST:
        if (showtype) (*dispfn)(dispctx, "list: ", 6);
        (*dispfn)(dispctx, "[", 1);
        len = osrp2(val->runsv.runsvstr) - 2;
        p = val->runsv.runsvstr + 2;
        while (len)
        {
            dbgpbval(ctx, (dattyp)*p, (uchar *)(p + 1), dispfn, dispctx);
            lstadv(&p, &len);
            if (len) (*dispfn)(dispctx, " ", 1);
        }
        (*dispfn)(dispctx, "]", 1);
        len = 0;
        break;
        
    case DAT_TRUE:
        p = (uchar *)"true";
        len = 4;
        break;
        
    case DAT_FNADDR:
        len = dbgnam(ctx, (char *)buf, TOKSTFUNC, val->runsv.runsvobj);
        typ = "function pointer";
        break;
        
    case DAT_PROPNUM:
        len = dbgnam(ctx, (char *)buf, TOKSTPROP, val->runsv.runsvprp);
        typ = "property pointer";
        break;
        
    default:
        p = (uchar *)"[unknown type]";
        len = 14;
        break;
    }

    /* show the type prefix if desired, or add a quote if it's a string */
    if (typ && showtype)
    {
        /* show the type prefix */
        (*dispfn)(dispctx, typ, (int)strlen(typ));
        (*dispfn)(dispctx, ": ", 2);
    }
    else if (val->runstyp == DAT_SSTRING)
    {
        /* it's a string, and we're not showing a type - add a quote */
        (*dispfn)(dispctx, "'", 1);
    }

    /* 
     *   if possible, null-terminate the buffer - do this only if the
     *   length is actually within the buffer, which won't be the case if
     *   the text comes from someplace outside the buffer (which is the
     *   case if it's a string, for example) 
     */
    if (len < sizeof(buf))
        buf[len] = '\0';

    /* display a "&" prefix if it's an address of some kind */
    if (val->runstyp == DAT_PROPNUM || val->runstyp == DAT_FNADDR)
        (*dispfn)(dispctx, "&", 1);

    /* display the text */
    if (len != 0)
        (*dispfn)(dispctx, (char *)p, len);

    /* add a closing quote if it's a string and we showed an open quote */
    if (val->runstyp == DAT_SSTRING && !(typ && showtype))
        (*dispfn)(dispctx, "'", 1);
}